

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O0

void Dar_BalanceUniqify(Aig_Obj_t *pObj,Vec_Ptr_t *vNodes,int fExor)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *p;
  Aig_Obj_t *pAVar3;
  int local_38;
  int local_34;
  int k;
  int i;
  Aig_Obj_t *pTempNext;
  Aig_Obj_t *pTemp;
  int fExor_local;
  Vec_Ptr_t *vNodes_local;
  Aig_Obj_t *pObj_local;
  
  Vec_PtrSort(vNodes,Dar_ObjCompareLits);
  local_38 = 0;
  local_34 = 0;
  do {
    iVar1 = Vec_PtrSize(vNodes);
    if (iVar1 <= local_34) {
LAB_005cba60:
      Vec_PtrShrink(vNodes,local_38);
      iVar1 = Vec_PtrSize(vNodes);
      if (1 < iVar1) {
        pTempNext = (Aig_Obj_t *)Vec_PtrEntry(vNodes,0);
        for (local_34 = 1; iVar1 = Vec_PtrSize(vNodes), local_34 < iVar1; local_34 = local_34 + 1) {
          pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vNodes,local_34);
          if (pTempNext == pAVar2) {
            __assert_fail("pTemp != pTempNext",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darBalance.c"
                          ,0x5a,"void Dar_BalanceUniqify(Aig_Obj_t *, Vec_Ptr_t *, int)");
          }
          pTempNext = pAVar2;
        }
      }
      return;
    }
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vNodes,local_34);
    iVar1 = Vec_PtrSize(vNodes);
    if (local_34 + 1 == iVar1) {
      Vec_PtrWriteEntry(vNodes,local_38,pAVar2);
      local_38 = local_38 + 1;
      goto LAB_005cba60;
    }
    p = (Aig_Obj_t *)Vec_PtrEntry(vNodes,local_34 + 1);
    if ((fExor == 0) && (pAVar3 = Aig_Not(p), pAVar2 == pAVar3)) {
      Vec_PtrClear(vNodes);
      return;
    }
    if (pAVar2 == p) {
      if (fExor != 0) {
        local_34 = local_34 + 1;
      }
    }
    else {
      Vec_PtrWriteEntry(vNodes,local_38,pAVar2);
      local_38 = local_38 + 1;
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

void Dar_BalanceUniqify( Aig_Obj_t * pObj, Vec_Ptr_t * vNodes, int fExor )
{
    Aig_Obj_t * pTemp, * pTempNext;
    int i, k;
    // sort the nodes by their literal
    Vec_PtrSort( vNodes, (int (*)())Dar_ObjCompareLits );
    // remove duplicates
    k = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pTemp, i )
    {
        if ( i + 1 == Vec_PtrSize(vNodes) )
        {
            Vec_PtrWriteEntry( vNodes, k++, pTemp );
            break;
        }
        pTempNext = (Aig_Obj_t *)Vec_PtrEntry( vNodes, i+1 );
        if ( !fExor && pTemp == Aig_Not(pTempNext) ) // pos_lit & neg_lit = 0
        {
            Vec_PtrClear( vNodes );
            return;
        }
        if ( pTemp != pTempNext )  // save if different
            Vec_PtrWriteEntry( vNodes, k++, pTemp );
        else if ( fExor ) // in case of XOR, remove identical
            i++;
    }
    Vec_PtrShrink( vNodes, k );
    if ( Vec_PtrSize(vNodes) < 2 )
        return;
    // check that there is no duplicates
    pTemp = (Aig_Obj_t *)Vec_PtrEntry( vNodes, 0 );
    Vec_PtrForEachEntryStart( Aig_Obj_t *, vNodes, pTempNext, i, 1 )
    {
        assert( pTemp != pTempNext );
        pTemp = pTempNext;
    }
}